

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O0

void __thiscall HAXX_UNARY_OP::quaternion_unary_sub::test_method(quaternion_unary_sub *this)

{
  undefined8 uVar1;
  bool bVar2;
  quaternion<double> p;
  quaternion<double> q;
  quaternion<double> *in_stack_fffffffffffffa88;
  quaternion<double> *in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [40];
  undefined1 local_390 [16];
  basic_cstring<const_char> local_380;
  undefined1 local_370 [32];
  undefined1 local_350 [40];
  undefined1 local_328 [16];
  basic_cstring<const_char> local_318;
  undefined1 local_308 [32];
  undefined1 local_2e8 [40];
  undefined1 local_2c0 [16];
  basic_cstring<const_char> local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [40];
  undefined1 local_258 [16];
  basic_cstring<const_char> local_248;
  undefined1 local_238 [32];
  undefined1 local_218 [40];
  undefined1 local_1f0 [16];
  basic_cstring<const_char> local_1e0;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [40];
  undefined1 local_188 [16];
  basic_cstring<const_char> local_178;
  undefined1 local_168 [32];
  undefined1 local_148 [40];
  undefined1 local_120 [16];
  basic_cstring<const_char> local_110;
  quaternion<double> local_100;
  basic_cstring<const_char> local_e0;
  undefined1 local_d0 [40];
  undefined1 local_a8 [16];
  basic_cstring<const_char> local_98;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_70 = 5.0;
  local_78 = 0.0;
  local_80 = 7.0;
  local_88 = 9.0;
  HAXX::quaternion<double>::quaternion(&local_68,&local_70,&local_78,&local_80,&local_88);
  HAXX::quaternion<double>::operator-=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0xb6,local_a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_100._M_imag_i = HAXX::quaternion<double>::real(&local_68);
    local_100._M_real = 4.0;
    in_stack_fffffffffffffa98 = "4.";
    in_stack_fffffffffffffa90 = &local_100;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_d0,&local_e0,0xb6,1,2,&local_100._M_imag_i,"p.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1afc30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0xb7,local_120);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_168 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_168._8_8_ = HAXX::quaternion<double>::imag_i(&local_68);
    local_168._0_8_ = -2.0;
    in_stack_fffffffffffffa98 = "-2.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_168;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_148,local_168 + 0x10,0xb7,1,2,local_168 + 8,"p.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1afd8d);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0xb8,local_188);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1d0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_1d0._8_8_ = HAXX::quaternion<double>::imag_j(&local_68);
    local_1d0._0_8_ = 4.0;
    in_stack_fffffffffffffa98 = "4.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_1d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1b0,local_1d0 + 0x10,0xb8,1,2,local_1d0 + 8,"p.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1afeea);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e0,0xb9,local_1f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_238 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_238._8_8_ = HAXX::quaternion<double>::imag_k(&local_68);
    local_238._0_8_ = 5.0;
    in_stack_fffffffffffffa98 = "5.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_238;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_218,local_238 + 0x10,0xb9,1,2,local_238 + 8,"p.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b0047);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0xbc,local_258);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2a0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_2a0._8_8_ = HAXX::quaternion<double>::real(&local_28);
    local_2a0._0_8_ = 1.0;
    in_stack_fffffffffffffa98 = "1.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_2a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_280,local_2a0 + 0x10,0xbc,1,2,local_2a0 + 8,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b01a4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b0,0xbd,local_2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_308 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_308._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_308._0_8_ = 2.0;
    in_stack_fffffffffffffa98 = "2.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_308;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_2e8,local_308 + 0x10,0xbd,1,2,local_308 + 8,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b0301);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_318,0xbe,local_328);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_370 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_370._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_370._0_8_ = 3.0;
    in_stack_fffffffffffffa98 = "3.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_370;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_350,local_370 + 0x10,0xbe,1,2,local_370 + 8,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b043a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_380,0xbf,local_390);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3d8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_3d8._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_3d8._0_8_ = 4.0;
    in_stack_fffffffffffffa98 = "4.";
    in_stack_fffffffffffffa90 = (quaternion<double> *)local_3d8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_3b8,local_3d8 + 0x10,0xbf,1,2,local_3d8 + 8,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b0573);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_unary_sub)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(5.,0.,7.,9.);
  p -= q;

  // Check that p has been changed properly
  BOOST_CHECK_EQUAL(p.real(),4.);
  BOOST_CHECK_EQUAL(p.imag_i(),-2.);
  BOOST_CHECK_EQUAL(p.imag_j(),4.);
  BOOST_CHECK_EQUAL(p.imag_k(),5.);

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}